

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

OPEN_HANDLE open_create(char *container_id_value)

{
  int iVar1;
  OPEN_HANDLE open;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  
  open = (OPEN_HANDLE)malloc(8);
  if (open != (OPEN_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x10);
    open->composite_value = value;
    if (value == (AMQP_VALUE)0x0) {
      free(open);
    }
    else {
      item_value = amqpvalue_create_string(container_id_value);
      iVar1 = amqpvalue_set_composite_item(value,0,item_value);
      amqpvalue_destroy(item_value);
      if (iVar1 == 0) {
        return open;
      }
      open_destroy(open);
    }
  }
  return (OPEN_HANDLE)0x0;
}

Assistant:

OPEN_HANDLE open_create(const char* container_id_value)
{
    OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)malloc(sizeof(OPEN_INSTANCE));
    if (open_instance != NULL)
    {
        open_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(16);
        if (open_instance->composite_value == NULL)
        {
            free(open_instance);
            open_instance = NULL;
        }
        else
        {
            AMQP_VALUE container_id_amqp_value;
            int result = 0;

            container_id_amqp_value = amqpvalue_create_string(container_id_value);
            if ((result == 0) && (amqpvalue_set_composite_item(open_instance->composite_value, 0, container_id_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(container_id_amqp_value);
            if (result != 0)
            {
                open_destroy(open_instance);
                open_instance = NULL;
            }
        }
    }

    return open_instance;
}